

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void checkShaderError(GLuint shader)

{
  ulong uVar1;
  uint in_EAX;
  int iVar2;
  char *__s;
  size_t sVar3;
  undefined4 in_register_0000003c;
  GLint logSize;
  GLint success;
  undefined8 local_28;
  
  local_28 = (ulong)in_EAX;
  (*__glewGetShaderiv)(CONCAT44(in_register_0000003c,shader),0x8b81,(long)&local_28 + 4);
  if (local_28._4_4_ == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Shader Compile Failed.",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    local_28 = local_28 & 0xffffffff00000000;
    (*__glewGetShaderiv)(shader,0x8b84,&local_28);
    uVar1 = local_28;
    if ((int)local_28 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No log found.",0xd);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
    }
    else {
      iVar2 = -1;
      if (-1 < (int)local_28) {
        iVar2 = (int)local_28;
      }
      __s = (char *)operator_new__((long)iVar2);
      (*__glewGetShaderInfoLog)(shader,uVar1 & 0xffffffff,&local_28,__s);
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      operator_delete__(__s);
    }
  }
  return;
}

Assistant:

void checkShaderError(GLuint shader) {
    GLint success = 0;
    glGetShaderiv(shader, GL_COMPILE_STATUS, &success);
    if (success) return;

    cout << "Shader Compile Failed." << endl;

    GLint logSize = 0;
    glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &logSize);
    if (logSize == 0) {
        cout << "No log found." << endl;
        return;
    }

    GLchar *log = new GLchar[logSize];

    glGetShaderInfoLog(shader, logSize, &logSize, log);

    cout << log << endl;

    delete[] log;
}